

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O0

void __thiscall
dlib::
memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
::~memory_manager_kernel_2
          (memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
           *this)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  chunk_node *temp;
  
  *in_RDI = &PTR__memory_manager_kernel_2_005550b0;
  if (in_RDI[1] == 0) {
    while (in_RDI[3] != 0) {
      puVar1 = (undefined8 *)in_RDI[3];
      in_RDI[3] = *(undefined8 *)(in_RDI[3] + 8);
      operator_delete((void *)*puVar1);
      if (puVar1 != (undefined8 *)0x0) {
        operator_delete(puVar1);
      }
    }
  }
  return;
}

Assistant:

virtual ~memory_manager_kernel_2(
        )
        {
            if (allocations == 0)
            {
                while (first_chunk != 0)
                {
                    chunk_node* temp = first_chunk;
                    first_chunk = first_chunk->next;
                    // delete the memory chunk 
                    ::operator delete ( static_cast<void*>(temp->chunk));
                    // delete the chunk_node
                    delete temp;
                }
            }
        }